

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdPermute(char *pDsd)

{
  char cVar1;
  int nVars;
  int pPerm [16];
  int aiStack_58 [18];
  
  nVars = Dau_DsdFindVarNum(pDsd);
  Dau_DsdGenRandPerm(aiStack_58,nVars);
  while( true ) {
    cVar1 = *pDsd;
    if (cVar1 == '\0') break;
    if ((int)cVar1 < nVars + 0x61 && '`' < cVar1) {
      *pDsd = (char)aiStack_58[(int)cVar1 - 0x61] + 'a';
    }
    pDsd = pDsd + 1;
  }
  return;
}

Assistant:

void Dau_DsdPermute( char * pDsd )
{
    int pPerm[16];
    int nVars = Dau_DsdFindVarNum( pDsd );
    Dau_DsdGenRandPerm( pPerm, nVars );
    pDsd--;
    while ( *++pDsd )
        if ( *pDsd >= 'a' && *pDsd < 'a' + nVars )
            *pDsd = 'a' + pPerm[*pDsd - 'a'];
}